

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O0

Time __thiscall helics::InputInfo::nextValueTime(InputInfo *this)

{
  bool bVar1;
  const_iterator this_00;
  const_reference pvVar2;
  vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
  *in_RDI;
  vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_> *q;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
  *__range1;
  Time nvtime;
  reference in_stack_ffffffffffffffd0;
  TimeRepresentation<count_time<9,_long>_> local_8;
  
  local_8.internalTimeCode = 0x7fffffffffffffff;
  if (((ulong)in_RDI[4].
              super__Vector_base<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish & 0x100000000) == 0) {
    this_00 = std::
              vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
              ::begin(in_RDI);
    std::
    vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
    ::end(in_RDI);
    while (bVar1 = __gnu_cxx::
                   operator==<const_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_*,_std::vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>_>
                             ((__normal_iterator<const_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_*,_std::vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>_>
                               *)in_stack_ffffffffffffffd0,
                              (__normal_iterator<const_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_*,_std::vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>_>
                               *)in_RDI), ((bVar1 ^ 0xffU) & 1) != 0) {
      in_stack_ffffffffffffffd0 =
           __gnu_cxx::
           __normal_iterator<const_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_*,_std::vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>_>
           ::operator*((__normal_iterator<const_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_*,_std::vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>_>
                        *)&stack0xffffffffffffffe0);
      bVar1 = std::
              vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
              ::empty(this_00._M_current);
      if (!bVar1) {
        pvVar2 = std::
                 vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                 ::front(in_stack_ffffffffffffffd0);
        bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<(&pvVar2->time,&local_8);
        if (bVar1) {
          pvVar2 = std::
                   vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                   ::front(in_stack_ffffffffffffffd0);
          local_8.internalTimeCode = (pvVar2->time).internalTimeCode;
        }
      }
      __gnu_cxx::
      __normal_iterator<const_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_*,_std::vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>_>
      ::operator++((__normal_iterator<const_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_*,_std::vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>_>
                    *)&stack0xffffffffffffffe0);
    }
  }
  return (Time)local_8.internalTimeCode;
}

Assistant:

Time InputInfo::nextValueTime() const
{
    Time nvtime = Time::maxVal();
    if (not_interruptible) {
        return nvtime;
    }
    for (const auto& q : data_queues) {
        if (!q.empty()) {
            if (q.front().time < nvtime) {
                nvtime = q.front().time;
            }
        }
    }
    return nvtime;
}